

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int begin_set_offered_capabilities(BEGIN_HANDLE begin,AMQP_VALUE offered_capabilities_value)

{
  int iVar1;
  AMQP_VALUE local_30;
  AMQP_VALUE offered_capabilities_amqp_value;
  BEGIN_INSTANCE *begin_instance;
  int result;
  AMQP_VALUE offered_capabilities_value_local;
  BEGIN_HANDLE begin_local;
  
  if (begin == (BEGIN_HANDLE)0x0) {
    begin_instance._4_4_ = 0xc61;
  }
  else {
    if (offered_capabilities_value == (AMQP_VALUE)0x0) {
      local_30 = (AMQP_VALUE)0x0;
    }
    else {
      local_30 = amqpvalue_clone(offered_capabilities_value);
    }
    if (local_30 == (AMQP_VALUE)0x0) {
      begin_instance._4_4_ = 0xc71;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(begin->composite_value,5,local_30);
      if (iVar1 == 0) {
        begin_instance._4_4_ = 0;
      }
      else {
        begin_instance._4_4_ = 0xc77;
      }
      amqpvalue_destroy(local_30);
    }
  }
  return begin_instance._4_4_;
}

Assistant:

int begin_set_offered_capabilities(BEGIN_HANDLE begin, AMQP_VALUE offered_capabilities_value)
{
    int result;

    if (begin == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        BEGIN_INSTANCE* begin_instance = (BEGIN_INSTANCE*)begin;
        AMQP_VALUE offered_capabilities_amqp_value;
        if (offered_capabilities_value == NULL)
        {
            offered_capabilities_amqp_value = NULL;
        }
        else
        {
            offered_capabilities_amqp_value = amqpvalue_clone(offered_capabilities_value);
        }
        if (offered_capabilities_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(begin_instance->composite_value, 5, offered_capabilities_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(offered_capabilities_amqp_value);
        }
    }

    return result;
}